

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O1

string * __thiscall websocketpp::uri::str_abi_cxx11_(string *__return_storage_ptr__,uri *this)

{
  ostream *poVar1;
  uint16_t uVar2;
  stringstream s;
  stringstream asStack_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_198,(this->m_scheme)._M_dataplus._M_p,(this->m_scheme)._M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"://",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(this->m_host)._M_dataplus._M_p,(this->m_host)._M_string_length);
  uVar2 = 0x50;
  if (this->m_secure != false) {
    uVar2 = 0x1bb;
  }
  if (uVar2 != this->m_port) {
    std::__ostream_insert<char,std::char_traits<char>>(local_198,":",1);
    std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,(this->m_resource)._M_dataplus._M_p,(this->m_resource)._M_string_length);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string str() const {
        std::stringstream s;

        s << m_scheme << "://" << m_host;

        if (m_port != (m_secure ? uri_default_secure_port : uri_default_port)) {
            s << ":" << m_port;
        }

        s << m_resource;
        return s.str();
    }